

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGNode::post_dominates_any_work
          (CFGNode *this,CFGNode *parent,UnorderedSet<const_CFGNode_*> *node_cache)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  size_type sVar3;
  __hashtable *__h;
  pointer ppCVar4;
  bool bVar5;
  bool bVar6;
  __node_gen_type __node_gen;
  CFGNode *local_38;
  UnorderedSet<const_CFGNode_*> *local_30;
  
  local_38 = parent;
  sVar3 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&node_cache->_M_h,&local_38);
  if (sVar3 == 0) {
    local_30 = node_cache;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)node_cache,&local_38);
    if (((local_38->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (local_38->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((local_38->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_38->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      ppCVar4 = (local_38->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = (local_38->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = ppCVar4 != ppCVar2;
      if (bVar5) {
        bVar6 = post_dominates_any_work(this,*ppCVar4,node_cache);
        while (!bVar6) {
          ppCVar4 = ppCVar4 + 1;
          bVar5 = ppCVar4 != ppCVar2;
          if (ppCVar4 == ppCVar2) {
            return bVar5;
          }
          bVar6 = post_dominates_any_work(this,*ppCVar4,node_cache);
        }
      }
    }
    else {
      while (bVar5 = local_38 == this, !bVar5) {
        pCVar1 = local_38->immediate_post_dominator;
        if (pCVar1 == (CFGNode *)0x0) {
          return bVar5;
        }
        bVar6 = local_38 == pCVar1;
        local_38 = pCVar1;
        if (bVar6) {
          return bVar5;
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CFGNode::post_dominates_any_work(const CFGNode *parent, UnorderedSet<const CFGNode *> &node_cache) const
{
	// If we reached this node before and didn't terminate, it must have returned false.
	if (node_cache.count(parent))
		return false;
	node_cache.insert(parent);

	// This is not a dummy block, we have an answer.
	if (!parent->ir.operations.empty() || !parent->ir.phi.empty())
		return post_dominates(parent);

	for (auto *p : parent->pred)
		if (post_dominates_any_work(p, node_cache))
			return true;

	return false;
}